

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTextElement.cpp
# Opt level: O1

void __thiscall KDReports::TextElement::TextElement(TextElement *this,TextElement *other)

{
  TextElementPrivate *pTVar1;
  int *piVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined7 uVar13;
  TextElementPrivate *pTVar14;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__TextElement_001741c0;
  pTVar14 = (TextElementPrivate *)operator_new(0x80);
  pTVar1 = (other->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  piVar2 = *(int **)&(pTVar1->m_string).d;
  *(int **)&(pTVar14->m_string).d = piVar2;
  *(char16_t **)((long)&(pTVar14->m_string).d + 8) = *(char16_t **)((long)&(pTVar1->m_string).d + 8)
  ;
  *(qsizetype *)((long)&(pTVar14->m_string).d + 0x10) =
       *(qsizetype *)((long)&(pTVar1->m_string).d + 0x10);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  piVar2 = (int *)(pTVar1->m_id).d.d;
  (pTVar14->m_id).d.d = (Data *)piVar2;
  *(char16_t **)((long)&(pTVar14->m_id).d + 8) = *(char16_t **)((long)&(pTVar1->m_id).d + 8);
  *(qsizetype *)((long)&(pTVar14->m_id).d + 0x10) = *(qsizetype *)((long)&(pTVar1->m_id).d + 0x10);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  piVar2 = (int *)(pTVar1->m_fontFamily).d.d;
  (pTVar14->m_fontFamily).d.d = (Data *)piVar2;
  *(char16_t **)((long)&(pTVar14->m_fontFamily).d + 8) =
       *(char16_t **)((long)&(pTVar1->m_fontFamily).d + 8);
  *(qsizetype *)((long)&(pTVar14->m_fontFamily).d + 0x10) =
       *(qsizetype *)((long)&(pTVar1->m_fontFamily).d + 0x10);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)&(pTVar14->m_foreground).ct + 2) =
       *(undefined8 *)((long)&(pTVar1->m_foreground).ct + 2);
  bVar4 = pTVar1->m_bold;
  bVar5 = pTVar1->m_boldIsSet;
  bVar6 = pTVar1->m_italic;
  bVar7 = pTVar1->m_italicIsSet;
  bVar8 = pTVar1->m_underline;
  bVar9 = pTVar1->m_underlineIsSet;
  bVar10 = pTVar1->m_strikeout;
  bVar11 = pTVar1->m_strikeoutIsSet;
  bVar12 = pTVar1->m_fontSet;
  uVar13 = *(undefined7 *)&pTVar1->field_0x51;
  uVar3 = *(undefined8 *)&pTVar1->m_foreground;
  pTVar14->m_pointSize = pTVar1->m_pointSize;
  *(undefined8 *)&pTVar14->m_foreground = uVar3;
  pTVar14->m_bold = bVar4;
  pTVar14->m_boldIsSet = bVar5;
  pTVar14->m_italic = bVar6;
  pTVar14->m_italicIsSet = bVar7;
  pTVar14->m_underline = bVar8;
  pTVar14->m_underlineIsSet = bVar9;
  pTVar14->m_strikeout = bVar10;
  pTVar14->m_strikeoutIsSet = bVar11;
  pTVar14->m_fontSet = bVar12;
  *(undefined7 *)&pTVar14->field_0x51 = uVar13;
  QFont::QFont(&pTVar14->m_font,&pTVar1->m_font);
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
  .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl = pTVar14;
  return;
}

Assistant:

KDReports::TextElement::TextElement(const TextElement &other)
    : Element(other)
    , d(new TextElementPrivate(*other.d))
{
}